

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O0

bool spvIsExtendedInstruction(Op opcode)

{
  bool local_9;
  Op opcode_local;
  
  if ((opcode == OpExtInst) || (opcode == OpExtInstWithForwardRefsKHR)) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool spvIsExtendedInstruction(const spv::Op opcode) {
  switch (opcode) {
    case spv::Op::OpExtInst:
    case spv::Op::OpExtInstWithForwardRefsKHR:
      return true;
    default:
      return false;
  }
}